

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_reflect.cpp
# Opt level: O1

void __thiscall spirv_cross::CompilerReflection::emit_entry_points(CompilerReflection *this)

{
  Stream *pSVar1;
  SpecializationConstant *pSVar2;
  size_t sVar3;
  SPIREntryPoint *pSVar4;
  WorkgroupSize *pWVar5;
  ExecutionModel model;
  uint32_t *puVar6;
  long lVar7;
  long lVar8;
  EntryPoint *pEVar9;
  EntryPoint *__i;
  EntryPoint *pEVar10;
  SpecializationConstant spec_z;
  SpecializationConstant spec_y;
  SpecializationConstant spec_x;
  SmallVector<spirv_cross::EntryPoint,_8UL> entries;
  string local_1d8;
  SpecializationConstant local_1b8;
  SpecializationConstant local_1b0;
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  SmallVector<spirv_cross::EntryPoint,_8UL> local_188;
  
  Compiler::get_entry_points_and_stages(&local_188,(Compiler *)this);
  sVar3 = local_188.super_VectorView<spirv_cross::EntryPoint>.buffer_size;
  pEVar9 = local_188.super_VectorView<spirv_cross::EntryPoint>.ptr;
  if (local_188.super_VectorView<spirv_cross::EntryPoint>.buffer_size != 0) {
    lVar7 = local_188.super_VectorView<spirv_cross::EntryPoint>.buffer_size * 0x28;
    pEVar10 = local_188.super_VectorView<spirv_cross::EntryPoint>.ptr +
              local_188.super_VectorView<spirv_cross::EntryPoint>.buffer_size;
    lVar8 = 0x3f;
    if (local_188.super_VectorView<spirv_cross::EntryPoint>.buffer_size != 0) {
      for (; local_188.super_VectorView<spirv_cross::EntryPoint>.buffer_size >> lVar8 == 0;
          lVar8 = lVar8 + -1) {
      }
    }
    ::std::
    __introsort_loop<spirv_cross::EntryPoint*,long,__gnu_cxx::__ops::_Iter_comp_iter<spirv_cross::CompilerReflection::emit_entry_points()::__0>>
              (local_188.super_VectorView<spirv_cross::EntryPoint>.ptr,pEVar10,
               ((uint)lVar8 ^ 0x3f) * 2 ^ 0x7e);
    if ((long)sVar3 < 0x11) {
      ::std::
      __insertion_sort<spirv_cross::EntryPoint*,__gnu_cxx::__ops::_Iter_comp_iter<spirv_cross::CompilerReflection::emit_entry_points()::__0>>
                (pEVar9,pEVar10);
    }
    else {
      pEVar10 = pEVar9 + 0x10;
      ::std::
      __insertion_sort<spirv_cross::EntryPoint*,__gnu_cxx::__ops::_Iter_comp_iter<spirv_cross::CompilerReflection::emit_entry_points()::__0>>
                (pEVar9,pEVar10);
      lVar7 = lVar7 + -0x280;
      do {
        ::std::
        __unguarded_linear_insert<spirv_cross::EntryPoint*,__gnu_cxx::__ops::_Val_comp_iter<spirv_cross::CompilerReflection::emit_entry_points()::__0>>
                  (pEVar10);
        pEVar10 = pEVar10 + 1;
        lVar7 = lVar7 + -0x28;
      } while (lVar7 != 0);
    }
    pSVar1 = (this->json_stream).super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"entryPoints","");
    simple_json::Stream::emit_json_key_array(pSVar1,&local_1d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p);
    }
    if (local_188.super_VectorView<spirv_cross::EntryPoint>.buffer_size != 0) {
      lVar8 = local_188.super_VectorView<spirv_cross::EntryPoint>.buffer_size * 0x28;
      pEVar9 = local_188.super_VectorView<spirv_cross::EntryPoint>.ptr;
      do {
        simple_json::Stream::begin_json_object
                  ((this->json_stream).
                   super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        pSVar1 = (this->json_stream).
                 super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"name","");
        simple_json::Stream::emit_json_key_value(pSVar1,&local_1d8,&pEVar9->name);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
          operator_delete(local_1d8._M_dataplus._M_p);
        }
        pSVar1 = (this->json_stream).
                 super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"mode","");
        execution_model_to_str_abi_cxx11_
                  ((string *)local_1a8,(CompilerReflection *)(ulong)pEVar9->execution_model,model);
        simple_json::Stream::emit_json_key_value(pSVar1,&local_1d8,(string *)local_1a8);
        if ((undefined1 *)CONCAT44(local_1a8._4_4_,local_1a8._0_4_) != local_198) {
          operator_delete((undefined1 *)CONCAT44(local_1a8._4_4_,local_1a8._0_4_));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
          operator_delete(local_1d8._M_dataplus._M_p);
        }
        if (pEVar9->execution_model == ExecutionModelGLCompute) {
          pSVar4 = Compiler::get_entry_point((Compiler *)this,&pEVar9->name,ExecutionModelGLCompute)
          ;
          local_1a8._0_4_ = 0;
          local_1b0.id.id = 0;
          local_1b8.id.id = 0;
          Compiler::get_work_group_size_specialization_constants
                    ((Compiler *)this,(SpecializationConstant *)local_1a8,&local_1b0,&local_1b8);
          pSVar1 = (this->json_stream).
                   super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_1d8,"workgroup_size","");
          simple_json::Stream::emit_json_key_array(pSVar1,&local_1d8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
            operator_delete(local_1d8._M_dataplus._M_p);
          }
          pWVar5 = &pSVar4->workgroup_size;
          if (local_1a8._0_4_ != 0) {
            pWVar5 = (WorkgroupSize *)(local_1a8 + 4);
          }
          simple_json::Stream::emit_json_array_value
                    ((this->json_stream).
                     super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                     pWVar5->x);
          pSVar2 = (SpecializationConstant *)&pSVar4->workgroup_size;
          if (local_1b0.id.id != 0) {
            pSVar2 = &local_1b0;
          }
          simple_json::Stream::emit_json_array_value
                    ((this->json_stream).
                     super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                     pSVar2->constant_id);
          puVar6 = &(pSVar4->workgroup_size).z;
          if (local_1b8.id.id != 0) {
            puVar6 = &local_1b8.constant_id;
          }
          simple_json::Stream::emit_json_array_value
                    ((this->json_stream).
                     super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                     *puVar6);
          simple_json::Stream::end_json_array
                    ((this->json_stream).
                     super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
          pSVar1 = (this->json_stream).
                   super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_1d8,"workgroup_size_is_spec_constant_id","");
          simple_json::Stream::emit_json_key_array(pSVar1,&local_1d8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
            operator_delete(local_1d8._M_dataplus._M_p);
          }
          simple_json::Stream::emit_json_array_value
                    ((this->json_stream).
                     super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                     local_1a8._0_4_ != 0);
          simple_json::Stream::emit_json_array_value
                    ((this->json_stream).
                     super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                     local_1b0.id.id != 0);
          simple_json::Stream::emit_json_array_value
                    ((this->json_stream).
                     super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                     local_1b8.id.id != 0);
          simple_json::Stream::end_json_array
                    ((this->json_stream).
                     super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        }
        simple_json::Stream::end_json_object
                  ((this->json_stream).
                   super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        pEVar9 = pEVar9 + 1;
        lVar8 = lVar8 + -0x28;
      } while (lVar8 != 0);
    }
    simple_json::Stream::end_json_array
              ((this->json_stream).
               super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  SmallVector<spirv_cross::EntryPoint,_8UL>::~SmallVector(&local_188);
  return;
}

Assistant:

void CompilerReflection::emit_entry_points()
{
	auto entries = get_entry_points_and_stages();
	if (!entries.empty())
	{
		// Needed to make output deterministic.
		sort(begin(entries), end(entries), [](const EntryPoint &a, const EntryPoint &b) -> bool {
			if (a.execution_model < b.execution_model)
				return true;
			else if (a.execution_model > b.execution_model)
				return false;
			else
				return a.name < b.name;
		});

		json_stream->emit_json_key_array("entryPoints");
		for (auto &e : entries)
		{
			json_stream->begin_json_object();
			json_stream->emit_json_key_value("name", e.name);
			json_stream->emit_json_key_value("mode", execution_model_to_str(e.execution_model));
			if (e.execution_model == ExecutionModelGLCompute)
			{
				const auto &spv_entry = get_entry_point(e.name, e.execution_model);

				SpecializationConstant spec_x, spec_y, spec_z;
				get_work_group_size_specialization_constants(spec_x, spec_y, spec_z);

				json_stream->emit_json_key_array("workgroup_size");
				json_stream->emit_json_array_value(spec_x.id != ID(0) ? spec_x.constant_id :
				                                                        spv_entry.workgroup_size.x);
				json_stream->emit_json_array_value(spec_y.id != ID(0) ? spec_y.constant_id :
				                                                        spv_entry.workgroup_size.y);
				json_stream->emit_json_array_value(spec_z.id != ID(0) ? spec_z.constant_id :
				                                                        spv_entry.workgroup_size.z);
				json_stream->end_json_array();

				json_stream->emit_json_key_array("workgroup_size_is_spec_constant_id");
				json_stream->emit_json_array_value(spec_x.id != ID(0));
				json_stream->emit_json_array_value(spec_y.id != ID(0));
				json_stream->emit_json_array_value(spec_z.id != ID(0));
				json_stream->end_json_array();
			}
			json_stream->end_json_object();
		}
		json_stream->end_json_array();
	}
}